

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseArraySegment.cpp
# Opt level: O0

bool Js::SparseArraySegmentBase::IsLeafSegment(SparseArraySegmentBase *seg,Recycler *recycler)

{
  bool bVar1;
  undefined1 local_48 [8];
  RecyclerHeapObjectInfo heapObject;
  Recycler *recycler_local;
  SparseArraySegmentBase *seg_local;
  
  heapObject._32_8_ = recycler;
  bVar1 = DoNativeArrayLeafSegment();
  if (bVar1) {
    Memory::RecyclerHeapObjectInfo::RecyclerHeapObjectInfo((RecyclerHeapObjectInfo *)local_48);
    bVar1 = Memory::Recycler::FindHeapObject
                      ((Recycler *)heapObject._32_8_,seg,
                       FindHeapObjectFlags_AllowInterior|
                       FindHeapObjectFlags_VerifyFreeBitForAttribute,
                       (RecyclerHeapObjectInfo *)local_48);
    if (bVar1) {
      seg_local._7_1_ = Memory::RecyclerHeapObjectInfo::IsLeaf((RecyclerHeapObjectInfo *)local_48);
    }
    else {
      seg_local._7_1_ = false;
    }
  }
  else {
    seg_local._7_1_ = false;
  }
  return seg_local._7_1_;
}

Assistant:

bool SparseArraySegmentBase::IsLeafSegment(SparseArraySegmentBase *seg, Recycler *recycler)
    {
        if (!DoNativeArrayLeafSegment())
        {
            return false;
        }

        RecyclerHeapObjectInfo heapObject;
        if (recycler->FindHeapObject(
                seg,
                (Memory::FindHeapObjectFlags)(FindHeapObjectFlags_VerifyFreeBitForAttribute | FindHeapObjectFlags_AllowInterior),
                heapObject))
        {
            return heapObject.IsLeaf();
        }

        return false;
    }